

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

size_t __thiscall diy::FileStorage::max_size(FileStorage *this)

{
  size_t sVar1;
  const_accessor local_20;
  
  critical_resource<unsigned_long,_tthread::fast_mutex>::const_access(&local_20,&this->max_size_);
  sVar1 = *local_20.x_;
  std::unique_lock<tthread::fast_mutex>::~unique_lock(&local_20.lock_);
  return sVar1;
}

Assistant:

size_t        max_size() const            { return (*max_size_.const_access()); }